

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

double * __thiscall google::protobuf::Map<long,_double>::at(Map<long,_double> *this,key_type *key)

{
  LogMessage *other;
  LogFinisher local_59;
  const_iterator it;
  LogMessage local_40;
  
  find(&it,this,key);
  if (it.it_.node_ == (Node *)0x0) {
    internal::LogMessage::LogMessage
              (&local_40,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
               ,0x418);
    other = internal::LogMessage::operator<<(&local_40,"CHECK failed: it != end(): ");
    internal::LogFinisher::operator=(&local_59,other);
    internal::LogMessage::~LogMessage(&local_40);
  }
  return &(((it.it_.node_)->kv).v_)->second;
}

Assistant:

const T& at(const key_type& key) const {
    const_iterator it = find(key);
    GOOGLE_CHECK(it != end());
    return it->second;
  }